

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_write(mg_connection *conn,void *buf,size_t len)

{
  uint uVar1;
  uint uVar2;
  time_t tVar3;
  int in_R9D;
  int iVar4;
  char *buf_00;
  uint uVar5;
  int iVar6;
  SSL *ssl;
  
  if (conn == (mg_connection *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0xffffffff;
    if (len < 0x80000000) {
      conn->request_state = 10;
      iVar6 = (int)len;
      if (conn->throttle < 1) {
        uVar1 = push_all(conn->phys_ctx,(FILE *)(ulong)(uint)(conn->client).sock,(SOCKET)conn->ssl,
                         (SSL *)buf,(char *)(len & 0xffffffff),in_R9D);
      }
      else {
        iVar4 = 0;
        tVar3 = time((time_t *)0x0);
        if (tVar3 == conn->last_throttle_time) {
          iVar4 = conn->last_throttle_bytes;
        }
        else {
          conn->last_throttle_time = tVar3;
          conn->last_throttle_bytes = 0;
        }
        uVar5 = conn->throttle - iVar4;
        buf_00 = (char *)(len & 0xffffffff);
        if ((int)uVar5 < iVar6) {
          buf_00 = (char *)(ulong)uVar5;
        }
        uVar2 = (uint)buf_00;
        uVar1 = push_all(conn->phys_ctx,(FILE *)(ulong)(uint)(conn->client).sock,(SOCKET)conn->ssl,
                         (SSL *)buf,buf_00,in_R9D);
        if ((uVar1 == uVar2) &&
           (conn->last_throttle_bytes = conn->last_throttle_bytes + uVar2, uVar1 = uVar2,
           (int)uVar5 < iVar6)) {
          ssl = (SSL *)((long)buf + (long)(int)uVar2);
          do {
            if (conn->phys_ctx->stop_flag != 0) break;
            uVar5 = iVar6 - uVar1;
            if (conn->throttle < (int)(iVar6 - uVar1)) {
              uVar5 = conn->throttle;
            }
            uVar2 = push_all(conn->phys_ctx,(FILE *)(ulong)(uint)(conn->client).sock,
                             (SOCKET)conn->ssl,ssl,(char *)(ulong)uVar5,in_R9D);
            if (uVar2 != uVar5) break;
            sleep(1);
            conn->last_throttle_bytes = uVar5;
            tVar3 = time((time_t *)0x0);
            conn->last_throttle_time = tVar3;
            ssl = ssl + (int)uVar5;
            uVar1 = uVar1 + uVar5;
          } while ((int)uVar1 < iVar6);
        }
      }
      if (0 < (int)uVar1) {
        conn->num_bytes_sent = conn->num_bytes_sent + (ulong)uVar1;
      }
    }
  }
  return uVar1;
}

Assistant:

CIVETWEB_API int
mg_write(struct mg_connection *conn, const void *buf, size_t len)
{
	time_t now;
	int n, total, allowed;

	if (conn == NULL) {
		return 0;
	}
	if (len > INT_MAX) {
		return -1;
	}

	/* Mark connection as "data sent" */
	conn->request_state = 10;
#if defined(USE_HTTP2)
	if (conn->protocol_type == PROTOCOL_TYPE_HTTP2) {
		http2_data_frame_head(conn, len, 0);
	}
#endif

	if (conn->throttle > 0) {
		if ((now = time(NULL)) != conn->last_throttle_time) {
			conn->last_throttle_time = now;
			conn->last_throttle_bytes = 0;
		}
		allowed = conn->throttle - conn->last_throttle_bytes;
		if (allowed > (int)len) {
			allowed = (int)len;
		}

		total = push_all(conn->phys_ctx,
		                 NULL,
		                 conn->client.sock,
		                 conn->ssl,
		                 (const char *)buf,
		                 allowed);

		if (total == allowed) {

			buf = (const char *)buf + total;
			conn->last_throttle_bytes += total;
			while ((total < (int)len)
			       && STOP_FLAG_IS_ZERO(&conn->phys_ctx->stop_flag)) {
				allowed = (conn->throttle > ((int)len - total))
				              ? (int)len - total
				              : conn->throttle;

				n = push_all(conn->phys_ctx,
				             NULL,
				             conn->client.sock,
				             conn->ssl,
				             (const char *)buf,
				             allowed);

				if (n != allowed) {
					break;
				}
				sleep(1);
				conn->last_throttle_bytes = allowed;
				conn->last_throttle_time = time(NULL);
				buf = (const char *)buf + n;
				total += n;
			}
		}
	} else {
		total = push_all(conn->phys_ctx,
		                 NULL,
		                 conn->client.sock,
		                 conn->ssl,
		                 (const char *)buf,
		                 (int)len);
	}
	if (total > 0) {
		conn->num_bytes_sent += total;
	}
	return total;
}